

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

bool __thiscall
ADPlanner::Search(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace,
                 vector<int,_std::allocator<int>_> *pathIds,int *PathCost,bool bFirstSolution,
                 bool bOptimalSolution,double MaxNumofSecs)

{
  double dVar1;
  DiscreteSpaceInformation *pDVar2;
  pointer pPVar3;
  unsigned_short uVar4;
  int iVar5;
  clock_t cVar6;
  clock_t cVar7;
  bool bVar8;
  uint uVar9;
  double dVar10;
  int solcost;
  PlannerStats tempStat;
  double local_80;
  undefined4 local_74;
  vector<int,_std::allocator<int>_> *local_70;
  double local_68;
  int *local_60;
  double local_58;
  value_type local_50;
  
  local_70 = pathIds;
  local_60 = PathCost;
  cVar6 = clock();
  this->TimeStarted = cVar6;
  this->searchexpands = 0;
  local_68 = this->repair_time;
  if (this->use_repair_time == false) {
    this->repair_time = MaxNumofSecs;
  }
  if (pSearchStateSpace->bReevaluatefvals == true) {
    pDVar2 = (this->super_SBPLPlanner).environment_;
    (*pDVar2->_vptr_DiscreteSpaceInformation[0x19])(pDVar2,(ulong)this->bforwardsearch);
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x28])(this,pSearchStateSpace);
  }
  if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x2c])(this,pSearchStateSpace);
  }
  if (bOptimalSolution) {
    pSearchStateSpace->eps = 1.0;
  }
  else {
    local_80 = MaxNumofSecs;
    if (!bFirstSolution) goto LAB_0013b65f;
  }
  this->repair_time = 1000000000.0;
  local_80 = 1000000000.0;
LAB_0013b65f:
  pPVar3 = (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar3) {
    (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar3;
  }
  local_58 = local_80 * 1000000.0;
  uVar9 = 0;
  while (((this->final_epsilon <= pSearchStateSpace->eps_satisfied &&
           pSearchStateSpace->eps_satisfied != this->final_epsilon &&
          (cVar6 = clock(), (double)(cVar6 - this->TimeStarted) < local_58)) &&
         (((pSearchStateSpace->eps_satisfied == 1000000000.0 &&
           (!NAN(pSearchStateSpace->eps_satisfied))) ||
          (cVar6 = clock(), (double)(cVar6 - this->TimeStarted) < this->repair_time * 1000000.0)))))
  {
    cVar6 = clock();
    uVar4 = pSearchStateSpace->searchiteration;
    if (uVar4 == 0) {
      pSearchStateSpace->searchiteration = 1;
      uVar4 = 1;
    }
    if (ABS(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < 1e-07 && !bFirstSolution) {
      dVar10 = pSearchStateSpace->eps - this->dec_eps;
      pSearchStateSpace->eps = dVar10;
      if (dVar10 < this->final_epsilon) {
        pSearchStateSpace->eps = this->final_epsilon;
      }
      pSearchStateSpace->bReevaluatefvals = true;
      pSearchStateSpace->bRebuildOpenList = true;
      pSearchStateSpace->searchiteration = uVar4 + 1;
LAB_0013b770:
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x26])(this,pSearchStateSpace);
    }
    else if ((pSearchStateSpace->bRebuildOpenList & 1U) != 0) goto LAB_0013b770;
    if (pSearchStateSpace->bReevaluatefvals == true) {
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x27])(this,pSearchStateSpace);
    }
    iVar5 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x25])(local_80,this,pSearchStateSpace);
    if (iVar5 == 1) {
      dVar10 = pSearchStateSpace->eps;
      pSearchStateSpace->eps_satisfied = dVar10;
    }
    else {
      dVar10 = pSearchStateSpace->eps_satisfied;
    }
    dVar1 = this->finitial_eps;
    if (dVar10 == dVar1) {
      if ((pSearchStateSpace->eps == dVar1) && (!NAN(pSearchStateSpace->eps) && !NAN(dVar1))) {
        cVar7 = clock();
        this->finitial_eps_planning_time = (double)(cVar7 - cVar6) / 1000000.0;
        this->num_of_expands_initial_solution = this->searchexpands - uVar9;
        dVar10 = pSearchStateSpace->eps_satisfied;
      }
    }
    pPVar3 = (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
        super__Vector_impl_data._M_start == pPVar3) {
LAB_0013b81b:
      local_50.expands = this->searchexpands - uVar9;
      local_50.eps = dVar10;
      cVar7 = clock();
      local_50.time = (double)(cVar7 - cVar6) / 1000000.0;
      local_50.cost = *(int *)((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x24)
      ;
      std::vector<PlannerStats,_std::allocator<PlannerStats>_>::push_back(&this->stats,&local_50);
    }
    else {
      pPVar3 = pPVar3 + -1;
      if ((dVar10 != pPVar3->eps) || (NAN(dVar10) || NAN(pPVar3->eps))) goto LAB_0013b81b;
    }
    if ((bFirstSolution) ||
       (uVar9 = this->searchexpands,
       *(int *)((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x24) == 1000000000)
       ) break;
  }
  this->repair_time = local_68;
  *local_60 = *(int *)((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x24);
  pDVar2 = (this->super_SBPLPlanner).environment_;
  this->MaxMemoryCounter =
       this->MaxMemoryCounter +
       ((uint)((ulong)((long)(pDVar2->StateID2IndexMapping).
                             super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pDVar2->StateID2IndexMapping).
                            super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 1) & 0xfffffffc);
  local_74 = 1000000000;
  if ((*local_60 == 1000000000) ||
     ((dVar10 = this->pSearchStateSpace_->eps_satisfied, dVar10 == 1000000000.0 && (!NAN(dVar10)))))
  {
    bVar8 = false;
  }
  else {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x34])(&local_50,this,pSearchStateSpace,&local_74)
    ;
    std::vector<int,_std::allocator<int>_>::_M_move_assign(local_70,&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
    bVar8 = true;
  }
  cVar6 = clock();
  this->final_eps_planning_time = (double)(cVar6 - this->TimeStarted) / 1000000.0;
  this->final_eps = pSearchStateSpace->eps_satisfied;
  return bVar8;
}

Assistant:

bool ADPlanner::Search(ADSearchStateSpace_t* pSearchStateSpace, vector<int>& pathIds, int & PathCost,
                       bool bFirstSolution, bool bOptimalSolution, double MaxNumofSecs)
{
    CKey key;
    TimeStarted = clock();
    searchexpands = 0;
    double old_repair_time = repair_time;
    if (!use_repair_time) repair_time = MaxNumofSecs;

#if DEBUG
    SBPL_FPRINTF(fDeb, "new search call (call number=%d)\n", pSearchStateSpace->callnumber);
#endif

    if (pSearchStateSpace->bReevaluatefvals) {
        // costs have changed or a new goal has been set
        environment_->EnsureHeuristicsUpdated(bforwardsearch);
        Reevaluatehvals(pSearchStateSpace);
    }


    if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
        //re-initialize state space
        ReInitializeSearchStateSpace(pSearchStateSpace);
    }

    if (bOptimalSolution) {
        pSearchStateSpace->eps = 1;
        MaxNumofSecs = INFINITECOST;
        repair_time = INFINITECOST;
    }
    else if (bFirstSolution) {
        MaxNumofSecs = INFINITECOST;
        repair_time = INFINITECOST;
    }

    //the main loop of AD*
    stats.clear();
    int prevexpands = 0;
    clock_t loop_time;
    while (pSearchStateSpace->eps_satisfied > final_epsilon &&
           (clock() - TimeStarted) < MaxNumofSecs * (double)CLOCKS_PER_SEC &&
               (pSearchStateSpace->eps_satisfied == INFINITECOST ||
               (clock() - TimeStarted) < repair_time * (double)CLOCKS_PER_SEC))
    {
        loop_time = clock();
        //it will be a new search iteration
        if (pSearchStateSpace->searchiteration == 0) pSearchStateSpace->searchiteration++;

        //decrease eps for all subsequent iterations
        if (fabs(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < ERR_EPS && !bFirstSolution) {
            pSearchStateSpace->eps = pSearchStateSpace->eps - dec_eps;
            if (pSearchStateSpace->eps < final_epsilon) pSearchStateSpace->eps = final_epsilon;

            pSearchStateSpace->bReevaluatefvals = true;
            pSearchStateSpace->bRebuildOpenList = true;

            pSearchStateSpace->searchiteration++;
        }

        //build a new open list by merging it with incons one
        if (pSearchStateSpace->bRebuildOpenList) BuildNewOPENList(pSearchStateSpace);

        //re-compute f-values if necessary and reorder the heap
        if (pSearchStateSpace->bReevaluatefvals) Reevaluatefvals(pSearchStateSpace);

        //improve or compute path
        if (ComputePath(pSearchStateSpace, MaxNumofSecs) == 1) {
            pSearchStateSpace->eps_satisfied = pSearchStateSpace->eps;
        }

        //print the solution cost and eps bound
        SBPL_PRINTF("eps=%f expands=%d g(sstart)=%d\n", pSearchStateSpace->eps_satisfied, searchexpands - prevexpands,
                    ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g);

        if (pSearchStateSpace->eps_satisfied == finitial_eps && pSearchStateSpace->eps == finitial_eps) {
            finitial_eps_planning_time = double(clock() - loop_time) / CLOCKS_PER_SEC;
            num_of_expands_initial_solution = searchexpands - prevexpands;
        }

        if (stats.empty() || pSearchStateSpace->eps_satisfied != stats.back().eps) {
            PlannerStats tempStat;
            tempStat.eps = pSearchStateSpace->eps_satisfied;
            tempStat.expands = searchexpands - prevexpands;
            tempStat.time = double(clock() - loop_time) / CLOCKS_PER_SEC;
            tempStat.cost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
            stats.push_back(tempStat);
        }

#if DEBUG
        SBPL_FPRINTF(fDeb, "eps=%f eps_sat=%f expands=%d g(sstart)=%d\n", pSearchStateSpace->eps,
                     pSearchStateSpace->eps_satisfied, searchexpands - prevexpands,
                     ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g);
#endif
        prevexpands = searchexpands;

        //if just the first solution then we are done
        if (bFirstSolution) break;

        //no solution exists
        if (((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g == INFINITECOST) break;

    }
    repair_time = old_repair_time;

#if DEBUG
    SBPL_FFLUSH(fDeb);
#endif

    PathCost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
    MaxMemoryCounter += environment_->StateID2IndexMapping.size() * sizeof(int);

    SBPL_PRINTF("MaxMemoryCounter = %d\n", MaxMemoryCounter);

    int solcost = INFINITECOST;
    bool ret = false;
    if (PathCost == INFINITECOST || pSearchStateSpace_->eps_satisfied == INFINITECOST) {
        SBPL_PRINTF("could not find a solution\n");
        ret = false;
    }
    else {
        SBPL_PRINTF("solution is found\n");

        pathIds = GetSearchPath(pSearchStateSpace, solcost);
        ret = true;
    }

    SBPL_PRINTF("total expands this call = %d, planning time = %.3f secs, solution cost=%d\n", searchexpands, (clock()
        - TimeStarted) / ((double)CLOCKS_PER_SEC), solcost);
    final_eps_planning_time = (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC);
    final_eps = pSearchStateSpace->eps_satisfied;

    //SBPL_FPRINTF(fStat, "%d %d\n", searchexpands, solcost);

    return ret;

}